

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O0

void __thiscall Assimp::Collada::Animation::~Animation(Animation *this)

{
  Animation *this_00;
  bool bVar1;
  reference ppAVar2;
  __normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
  local_20;
  __normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
  local_18;
  iterator it;
  Animation *this_local;
  
  it._M_current = (Animation **)this;
  local_18._M_current =
       (Animation **)
       std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::
       begin(&this->mSubAnims);
  while( true ) {
    local_20._M_current =
         (Animation **)
         std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::
         end(&this->mSubAnims);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppAVar2 = __gnu_cxx::
              __normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppAVar2;
    if (this_00 != (Animation *)0x0) {
      ~Animation(this_00);
      operator_delete(this_00,0x50);
    }
    __gnu_cxx::
    __normal_iterator<Assimp::Collada::Animation_**,_std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::~vector
            (&this->mSubAnims);
  std::vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
  ::~vector(&this->mChannels);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Animation()
    {
        for( std::vector<Animation*>::iterator it = mSubAnims.begin(); it != mSubAnims.end(); ++it)
            delete *it;
    }